

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O3

string * __thiscall
flatbuffers::Namer::Denamespace
          (string *__return_storage_ptr__,Namer *this,string *s,string *namespace_prefix,
          char delimiter)

{
  pointer pcVar1;
  long lVar2;
  undefined7 in_register_00000081;
  long *local_48 [2];
  long local_38 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)s,CONCAT71(in_register_00000081,delimiter) & 0xffffffff)
  ;
  if (lVar2 == -1) {
    std::__cxx11::string::_M_replace
              ((ulong)namespace_prefix,0,(char *)namespace_prefix->_M_string_length,0x36bc82);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)s);
    std::__cxx11::string::operator=((string *)namespace_prefix,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Denamespace(const std::string &s,
                                  std::string &namespace_prefix,
                                  const char delimiter = '.') const {
    const size_t pos = s.find_last_of(delimiter);
    if (pos == std::string::npos) {
      namespace_prefix = "";
      return s;
    }
    namespace_prefix = s.substr(0, pos);
    return s.substr(pos + 1);
  }